

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_portrange(compiler_state_t *cstate,int port1,int port2,int ip_proto,int dir)

{
  block *b0_00;
  block *pbVar1;
  block *tmp;
  block *b1;
  block *b0;
  int dir_local;
  int ip_proto_local;
  int port2_local;
  int port1_local;
  compiler_state_t *cstate_local;
  
  b0_00 = gen_linktype(cstate,0x800);
  if (ip_proto == -1) {
    pbVar1 = gen_portrangeop(cstate,port1,port2,6,dir);
    tmp = gen_portrangeop(cstate,port1,port2,0x11,dir);
    gen_or(pbVar1,tmp);
    pbVar1 = gen_portrangeop(cstate,port1,port2,0x84,dir);
    gen_or(pbVar1,tmp);
  }
  else {
    if (((ip_proto != 6) && (ip_proto != 0x11)) && (ip_proto != 0x84)) {
      abort();
    }
    tmp = gen_portrangeop(cstate,port1,port2,ip_proto,dir);
  }
  gen_and(b0_00,tmp);
  return tmp;
}

Assistant:

static struct block *
gen_portrange(compiler_state_t *cstate, int port1, int port2, int ip_proto,
    int dir)
{
	struct block *b0, *b1, *tmp;

	/* link proto ip */
	b0 = gen_linktype(cstate, ETHERTYPE_IP);

	switch (ip_proto) {
	case IPPROTO_UDP:
	case IPPROTO_TCP:
	case IPPROTO_SCTP:
		b1 = gen_portrangeop(cstate, port1, port2, ip_proto, dir);
		break;

	case PROTO_UNDEF:
		tmp = gen_portrangeop(cstate, port1, port2, IPPROTO_TCP, dir);
		b1 = gen_portrangeop(cstate, port1, port2, IPPROTO_UDP, dir);
		gen_or(tmp, b1);
		tmp = gen_portrangeop(cstate, port1, port2, IPPROTO_SCTP, dir);
		gen_or(tmp, b1);
		break;

	default:
		abort();
	}
	gen_and(b0, b1);
	return b1;
}